

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O3

char * CVmObjString::alloc_str_buf(vm_val_t *new_obj,char *buf,size_t buf_size,size_t required_size)

{
  vm_obj_id_t vVar1;
  
  if (buf_size < required_size || buf == (char *)0x0) {
    vVar1 = create(0,required_size);
    new_obj->typ = VM_OBJ;
    (new_obj->val).obj = vVar1;
    buf = *(char **)((long)&G_obj_table_X.pages_[vVar1 >> 0xc][vVar1 & 0xfff].ptr_ + 8);
  }
  else {
    new_obj->typ = VM_NIL;
  }
  return buf;
}

Assistant:

char *CVmObjString::alloc_str_buf(VMG_ vm_val_t *new_obj,
                                  char *buf, size_t buf_size,
                                  size_t required_size)
{
    /* if the provided buffer is large enough, use it */
    if (buf != 0 && buf_size >= required_size)
    {
        /* there's no new object */
        new_obj->set_nil();
        
        /* return the buffer */
        return buf;
    }

    /* allocate a new string object */
    new_obj->set_obj(CVmObjString::create(vmg_ FALSE, required_size));

    /* return the new object's full string buffer from the length prefix */
    return ((CVmObjString *)vm_objp(vmg_ new_obj->val.obj))->ext_;
}